

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarmath_p.h
# Opt level: O1

R_conflict20 QRomanCalendrical::dayInYearToYmd(int dayInYear)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  R_conflict20 RVar7;
  
  iVar1 = dayInYear * 5;
  if (dayInYear < 0) {
    iVar5 = iVar1 + (int)((ulong)((long)(iVar1 + 3) * -0x29d47f29) >> 0x20) + 3;
    iVar3 = -(iVar5 >> 0x1f);
    iVar5 = iVar5 >> 7;
    uVar2 = (iVar5 + iVar3) - 1;
    uVar4 = iVar1 + 3 + (iVar5 + iVar3) * -0x99 + 0x98;
  }
  else {
    uVar2 = (iVar1 + 2U) / 0x99;
    uVar4 = (iVar1 + 2U) % 0x99;
  }
  if ((int)uVar2 < -2) {
    iVar3 = uVar2 + 3;
    iVar5 = iVar3 >> 0x1f;
    iVar1 = iVar3 / 0xc + iVar5;
    uVar6 = (iVar1 - iVar5) - 1;
    uVar2 = iVar3 + (iVar1 - iVar5) * -0xc + 0xb;
  }
  else {
    uVar6 = (uVar2 + 2) / 0xc;
    uVar2 = (uVar2 + 2) % 0xc;
  }
  RVar7.day = uVar4 / 5 + 1;
  RVar7._0_8_ = CONCAT44(uVar2,uVar6) + 0x100000000;
  return RVar7;
}

Assistant:

constexpr auto dayInYearToYmd(int dayInYear)
{
    // The year is an adjustment to the year for which dayInYear may be denormal.
    struct R { int year; int month; int day; };
    // Shared code for Julian and Milankovic (at least).
    using namespace QRoundingDown;
    const auto month5Day = qDivMod<FiveMonths>(5 * dayInYear + 2);
    // Its remainder changes by 5 per day, except at roughly monthly quotient steps.
    const auto yearMonth = qDivMod<12>(month5Day.quotient + 2);
    return R { yearMonth.quotient, yearMonth.remainder + 1, qDiv<5>(month5Day.remainder) + 1 };
}